

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 sqlite3TriggerColmask
              (Parse *pParse,Trigger *pTrigger,ExprList *pChanges,int isNew,int tr_tm,Table *pTab,
              int orconf)

{
  uint uVar1;
  int iVar2;
  TriggerPrg *pTVar3;
  int in_ECX;
  Table *in_RDX;
  Trigger *in_RSI;
  Parse *in_RDI;
  byte in_R8B;
  long in_R9;
  TriggerPrg *pPrg;
  Trigger *p;
  u32 mask;
  int op;
  Trigger *pTrigger_00;
  uint local_4;
  
  uVar1 = 0x81;
  if (in_RDX != (Table *)0x0) {
    uVar1 = 0x82;
  }
  local_4 = 0;
  pTrigger_00 = in_RSI;
  if (*(char *)(in_R9 + 0x3f) == '\x02') {
    local_4 = 0xffffffff;
  }
  else {
    for (; in_RSI != (Trigger *)0x0; in_RSI = in_RSI->pNext) {
      if (((in_RSI->op == uVar1) && ((in_R8B & in_RSI->tr_tm) != 0)) &&
         (iVar2 = checkColumnOverlap((IdList *)CONCAT44(uVar1,local_4),(ExprList *)in_RSI),
         iVar2 != 0)) {
        if (in_RSI->bReturning == '\0') {
          pTVar3 = getRowTrigger(in_RDI,pTrigger_00,in_RDX,in_ECX);
          if (pTVar3 != (TriggerPrg *)0x0) {
            local_4 = pTVar3->aColmask[in_ECX] | local_4;
          }
        }
        else {
          local_4 = 0xffffffff;
        }
      }
    }
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE u32 sqlite3TriggerColmask(
  Parse *pParse,       /* Parse context */
  Trigger *pTrigger,   /* List of triggers on table pTab */
  ExprList *pChanges,  /* Changes list for any UPDATE OF triggers */
  int isNew,           /* 1 for new.* ref mask, 0 for old.* ref mask */
  int tr_tm,           /* Mask of TRIGGER_BEFORE|TRIGGER_AFTER */
  Table *pTab,         /* The table to code triggers from */
  int orconf           /* Default ON CONFLICT policy for trigger steps */
){
  const int op = pChanges ? TK_UPDATE : TK_DELETE;
  u32 mask = 0;
  Trigger *p;

  assert( isNew==1 || isNew==0 );
  if( IsView(pTab) ){
    return 0xffffffff;
  }
  for(p=pTrigger; p; p=p->pNext){
    if( p->op==op
     && (tr_tm&p->tr_tm)
     && checkColumnOverlap(p->pColumns,pChanges)
    ){
      if( p->bReturning ){
        mask = 0xffffffff;
      }else{
        TriggerPrg *pPrg;
        pPrg = getRowTrigger(pParse, p, pTab, orconf);
        if( pPrg ){
          mask |= pPrg->aColmask[isNew];
        }
      }
    }
  }

  return mask;
}